

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateSerializeWithCachedSizesBody(google::
protobuf::io::Printer*,bool)::LazySerializerEmitter::Emit(google::protobuf::FieldDescriptor_const__
          (void *this,FieldDescriptor *field)

{
  int iVar1;
  long lVar2;
  Printer *this_00;
  ulong uVar3;
  int iVar4;
  char *pcVar5;
  int in_EDX;
  int extraout_EDX;
  FieldDescriptor *pFVar6;
  FieldDescriptor *field_local;
  string local_48;
  
  pFVar6 = field;
  field_local = field;
  if ((*(char *)((long)this + 0x11) != '\0') ||
     ((*(long **)((long)this + 0x18) != *(long **)((long)this + 0x20) &&
      (*(long *)(**(long **)((long)this + 0x18) + 0x60) != *(long *)(field + 0x60))))) {
    GenerateSerializeWithCachedSizesBody::LazySerializerEmitter::Flush
              ((LazySerializerEmitter *)this);
    in_EDX = extraout_EDX;
  }
  if (*(long *)(field + 0x60) == 0) {
    if (((*(char *)(*(long *)(field + 0x80) + 0x6f) == '\0') && (*(int *)(field + 0x4c) != 3)) &&
       (*(char *)((long)this + 0x11) == '\0')) {
      lVar2 = *this;
      pcVar5 = FieldDescriptor::index(field,(char *)pFVar6,in_EDX);
      iVar1 = *(int *)(*(long *)(lVar2 + 0xc0) + (long)(int)pcVar5 * 4);
      uVar3 = (long)iVar1 / 0x20;
      iVar4 = (int)uVar3;
      if (*(int *)((long)this + 0x30) != iVar4) {
        this_00 = *(Printer **)((long)this + 8);
        SimpleItoa_abi_cxx11_(&local_48,(protobuf *)(uVar3 & 0xffffffff),iVar1 % 0x20);
        protobuf::io::Printer::Print
                  (this_00,"cached_has_bits = _has_bits_[$new_index$];\n","new_index",&local_48);
        std::__cxx11::string::~string((string *)&local_48);
        *(int *)((long)this + 0x30) = iVar4;
      }
    }
    GenerateSerializeOneField
              (*this,*(Printer **)((long)this + 8),field,*(bool *)((long)this + 0x10),
               *(int *)((long)this + 0x30));
  }
  else {
    std::
    vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
    ::push_back((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)((long)this + 0x18),&field_local);
  }
  return;
}

Assistant:

void Emit(const FieldDescriptor* field) {
      if (eager_ || MustFlush(field)) {
        Flush();
      }
      if (field->containing_oneof() == NULL) {
        // TODO(ckennelly): Defer non-oneof fields similarly to oneof fields.

        if (!field->options().weak() && !field->is_repeated() && !eager_) {
          // We speculatively load the entire _has_bits_[index] contents, even
          // if it is for only one field.  Deferring non-oneof emitting would
          // allow us to determine whether this is going to be useful.
          int has_bit_index = mg_->has_bit_indices_[field->index()];
          if (cached_has_bit_index_ != has_bit_index / 32) {
            // Reload.
            int new_index = has_bit_index / 32;

            printer_->Print(
                "cached_has_bits = _has_bits_[$new_index$];\n",
                "new_index", SimpleItoa(new_index));

            cached_has_bit_index_ = new_index;
          }
        }

        mg_->GenerateSerializeOneField(
            printer_, field, to_array_, cached_has_bit_index_);
      } else {
        v_.push_back(field);
      }
    }